

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

void __thiscall
chaiscript::eval::Prefix_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_>::Prefix_AST_Node
          (Prefix_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this,string *t_ast_node_text,
          Parse_Location *t_loc,
          vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
          *t_children)

{
  Opers OVar1;
  undefined1 t_is_unary;
  Parse_Location *t_loc_00;
  __sv_type _Var2;
  string_view t_str;
  Operators *local_90;
  char *local_88;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  local_80;
  Parse_Location local_68;
  string local_48;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  *local_28;
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  *t_children_local;
  Parse_Location *t_loc_local;
  string *t_ast_node_text_local;
  Prefix_AST_Node<chaiscript::eval::Tracer<Count_Tracer>_> *this_local;
  
  local_28 = t_children;
  t_children_local =
       (vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
        *)t_loc;
  t_loc_local = (Parse_Location *)t_ast_node_text;
  t_ast_node_text_local = (string *)this;
  std::__cxx11::string::string((string *)&local_48,t_ast_node_text);
  Parse_Location::Parse_Location(&local_68,t_loc);
  Catch::clara::std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ::vector(&local_80,t_children);
  t_loc_00 = &local_68;
  AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>::AST_Node_Impl
            (&this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,&local_48,Prefix,
             t_loc_00,&local_80);
  t_is_unary = SUB81(t_loc_00,0);
  Catch::clara::std::
  vector<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>,_std::allocator<std::unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>_>_>_>_>
  ::~vector(&local_80);
  Parse_Location::~Parse_Location(&local_68);
  std::__cxx11::string::~string((string *)&local_48);
  (this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).super_AST_Node._vptr_AST_Node
       = (_func_int **)&PTR_get_children_00d66378;
  _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                    ((string *)
                     &(this->super_AST_Node_Impl<chaiscript::eval::Tracer<Count_Tracer>_>).
                      super_AST_Node.text);
  local_90 = (Operators *)_Var2._M_len;
  local_88 = _Var2._M_str;
  t_str._M_str = (char *)0x1;
  t_str._M_len = (size_t)local_88;
  OVar1 = Operators::to_operator(local_90,t_str,(bool)t_is_unary);
  this->m_oper = OVar1;
  Catch::clara::std::atomic<unsigned_long>::atomic(&this->m_loc,0);
  return;
}

Assistant:

Prefix_AST_Node(std::string t_ast_node_text, Parse_Location t_loc, std::vector<AST_Node_Impl_Ptr<T>> t_children)
          : AST_Node_Impl<T>(std::move(t_ast_node_text), AST_Node_Type::Prefix, std::move(t_loc), std::move(t_children))
          , m_oper(Operators::to_operator(this->text, true)) {
      }